

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O1

void HTTPAPIEX_Destroy(HTTPAPIEX_HANDLE handle)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t index;
  
  if (handle != (HTTPAPIEX_HANDLE)0x0) {
    if (handle->k == 2) {
      HTTPAPI_CloseConnection(handle->httpHandle);
      if (useGlobalInitialization == 0) {
        HTTPAPI_Deinit();
      }
    }
    STRING_delete(handle->hostName);
    sVar1 = VECTOR_size(handle->savedOptions);
    if (sVar1 != 0) {
      index = 0;
      do {
        puVar2 = (undefined8 *)VECTOR_element(handle->savedOptions,index);
        free((void *)*puVar2);
        free((void *)puVar2[1]);
        index = index + 1;
        *puVar2 = 0;
        puVar2[1] = 0;
      } while (sVar1 != index);
    }
    VECTOR_destroy(handle->savedOptions);
    free(handle);
    return;
  }
  return;
}

Assistant:

void HTTPAPIEX_Destroy(HTTPAPIEX_HANDLE handle)
{
    if (handle != NULL)
    {
        /*Codes_SRS_HTTPAPIEX_02_042: [HTTPAPIEX_Destroy shall free all the resources used by HTTAPIEX_HANDLE.]*/
        size_t i;
        size_t vectorSize;
        HTTPAPIEX_HANDLE_DATA* handleData = (HTTPAPIEX_HANDLE_DATA*)handle;

        if (handleData->k == 2)
        {
            HTTPAPI_CloseConnection(handleData->httpHandle);
            /*Codes_SRS_HTTPAPIEX_21_050: [If HTTPAPIEX_Init was called, HTTPAPI_Destroy shall not call HTTPAPI_Deinit.] */
            if (useGlobalInitialization == 0)
            {
                HTTPAPI_Deinit();
            }
        }
        STRING_delete(handleData->hostName);

        vectorSize = VECTOR_size(handleData->savedOptions);
        for (i = 0; i < vectorSize; i++)
        {
            HTTPAPIEX_SAVED_OPTION* savedOption = (HTTPAPIEX_SAVED_OPTION*)VECTOR_element(handleData->savedOptions, i);
            free((void*)savedOption->optionName);
            free((void*)savedOption->value);
            savedOption->optionName = NULL;
            savedOption->value = NULL;
        }
        VECTOR_destroy(handleData->savedOptions);

        free(handle);
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_043: [If parameter handle is NULL then HTTPAPIEX_Destroy shall take no action.] */
    }
}